

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O2

int strsm_(char *side,char *uplo,char *transa,char *diag,integer *m,integer *n,real *alpha,real *a,
          integer *lda,real *b,integer *ldb)

{
  int iVar1;
  logical lVar2;
  logical lVar3;
  logical lVar4;
  logical lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  real *prVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  real *prVar25;
  integer iVar26;
  integer *piVar27;
  long lVar28;
  float fVar29;
  
  iVar11 = *lda;
  uVar8 = (ulong)iVar11;
  iVar21 = *ldb;
  uVar9 = (ulong)iVar21;
  lVar2 = lsame_(side,"L");
  piVar27 = m;
  if (lVar2 == 0) {
    piVar27 = n;
  }
  iVar14 = *piVar27;
  lVar3 = lsame_(diag,"N");
  lVar4 = lsame_(uplo,"U");
  strsm_::info = 0;
  if ((lVar2 != 0) || (lVar5 = lsame_(side,"R"), iVar26 = 1, lVar5 != 0)) {
    if ((lVar4 == 0) && (lVar5 = lsame_(uplo,"L"), lVar5 == 0)) {
      iVar26 = 2;
    }
    else {
      lVar5 = lsame_(transa,"N");
      if (((lVar5 == 0) && (lVar5 = lsame_(transa,"T"), lVar5 == 0)) &&
         (lVar5 = lsame_(transa,"C"), lVar5 == 0)) {
        iVar26 = 3;
      }
      else {
        lVar5 = lsame_(diag,"U");
        if ((lVar5 == 0) && (lVar5 = lsame_(diag,"N"), lVar5 == 0)) {
          iVar26 = 4;
        }
        else {
          iVar1 = *m;
          if (iVar1 < 0) {
            iVar26 = 5;
          }
          else {
            uVar18 = *n;
            if ((int)uVar18 < 0) {
              iVar26 = 6;
            }
            else {
              iVar26 = 1;
              if (1 < iVar14) {
                iVar26 = iVar14;
              }
              if (*lda < iVar26) {
                iVar26 = 9;
              }
              else if (*ldb < (int)(iVar1 + (uint)(iVar1 == 0))) {
                iVar26 = 0xb;
              }
              else {
                iVar26 = strsm_::info;
                if (strsm_::info == 0) {
                  if ((ulong)uVar18 == 0) {
                    return 0;
                  }
                  uVar15 = ~uVar9;
                  if ((*alpha == 0.0) && (!NAN(*alpha))) {
                    uVar8 = (ulong)(uint)*m;
                    if (*m < 1) {
                      uVar8 = 0;
                    }
                    prVar10 = b + uVar15 + uVar9 + 1;
                    for (lVar16 = 1; lVar16 != (ulong)uVar18 + 1; lVar16 = lVar16 + 1) {
                      for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
                        prVar10[uVar15] = 0.0;
                      }
                      prVar10 = prVar10 + uVar9;
                    }
                    return 0;
                  }
                  uVar12 = ~uVar8;
                  lVar5 = lsame_(transa,"N");
                  iVar11 = iVar11 + 1;
                  uVar18 = *n;
                  uVar13 = (ulong)(int)uVar18;
                  if (lVar2 != 0) {
                    uVar7 = 0;
                    if (0 < (int)uVar18) {
                      uVar7 = uVar18;
                    }
                    uVar13 = (ulong)(uVar7 + 1);
                    if (lVar5 != 0) {
                      if (lVar4 != 0) {
                        prVar10 = b + uVar15 + uVar9 + 1;
                        uVar20 = 1;
                        for (uVar19 = uVar20; uVar19 != uVar13; uVar19 = uVar19 + 1) {
                          if ((*alpha != 1.0) || (NAN(*alpha))) {
                            uVar22 = (ulong)(uint)*m;
                            if (*m < 1) {
                              uVar22 = 0;
                            }
                            for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                              prVar10[uVar23] = *alpha * prVar10[uVar23];
                            }
                          }
                          lVar28 = uVar19 * uVar9;
                          lVar16 = (long)*m;
                          lVar24 = (long)a + uVar8 * 4 * lVar16 + uVar12 * 4;
                          for (; 0 < lVar16; lVar16 = lVar16 + -1) {
                            fVar29 = b[uVar15 + lVar28 + lVar16];
                            if ((fVar29 != 0.0) || (NAN(fVar29))) {
                              uVar22 = uVar20;
                              if (lVar3 != 0) {
                                b[uVar15 + lVar28 + lVar16] =
                                     fVar29 / a[uVar12 + (long)(iVar11 * (int)lVar16)];
                              }
                              for (; (long)uVar22 < lVar16; uVar22 = uVar22 + 1) {
                                b[uVar15 + lVar28 + uVar22] =
                                     b[uVar15 + lVar28 + uVar22] -
                                     b[uVar15 + lVar28 + lVar16] * *(float *)(lVar24 + uVar22 * 4);
                              }
                            }
                            lVar24 = lVar24 + uVar8 * -4;
                          }
                          prVar10 = prVar10 + uVar9;
                        }
                        return 0;
                      }
                      prVar10 = b + uVar15 + uVar9 + 1;
                      for (uVar20 = 1; uVar20 != uVar13; uVar20 = uVar20 + 1) {
                        if ((*alpha != 1.0) || (NAN(*alpha))) {
                          uVar19 = (ulong)(uint)*m;
                          if (*m < 1) {
                            uVar19 = 0;
                          }
                          for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
                            prVar10[uVar22] = *alpha * prVar10[uVar22];
                          }
                        }
                        lVar16 = uVar20 * uVar9;
                        iVar21 = *m;
                        if (iVar21 < 1) {
                          iVar21 = 0;
                        }
                        iVar14 = 2;
                        for (uVar19 = 1; uVar19 != iVar21 + 1; uVar19 = uVar19 + 1) {
                          fVar29 = b[uVar15 + lVar16 + uVar19];
                          if ((fVar29 != 0.0) || (NAN(fVar29))) {
                            if (lVar3 != 0) {
                              b[uVar15 + lVar16 + uVar19] =
                                   fVar29 / a[uVar12 + (long)(iVar11 * (int)uVar19)];
                            }
                            iVar1 = *m;
                            for (iVar17 = iVar14; iVar17 + -1 < iVar1; iVar17 = iVar17 + 1) {
                              lVar24 = (long)iVar17;
                              b[uVar15 + lVar16 + lVar24] =
                                   b[uVar15 + lVar16 + lVar24] -
                                   b[uVar15 + lVar16 + uVar19] * a[uVar12 + uVar19 * uVar8 + lVar24]
                              ;
                            }
                          }
                          iVar14 = iVar14 + 1;
                        }
                        prVar10 = prVar10 + uVar9;
                      }
                      return 0;
                    }
                    if (lVar4 != 0) {
                      prVar10 = b + uVar15 + uVar9 + 1;
                      for (uVar20 = 1; uVar20 != uVar13; uVar20 = uVar20 + 1) {
                        iVar21 = *m;
                        if (iVar21 < 1) {
                          iVar21 = 0;
                        }
                        lVar16 = 0;
                        prVar25 = a + uVar8 + uVar12 + 1;
                        for (uVar19 = 1; uVar19 != iVar21 + 1; uVar19 = uVar19 + 1) {
                          fVar29 = *alpha * b[uVar15 + uVar20 * uVar9 + uVar19];
                          for (lVar24 = 0; lVar16 != lVar24; lVar24 = lVar24 + 1) {
                            fVar29 = fVar29 - prVar25[lVar24] * prVar10[lVar24];
                          }
                          if (lVar3 != 0) {
                            fVar29 = fVar29 / a[uVar12 + (long)(iVar11 * (int)uVar19)];
                          }
                          b[uVar15 + uVar20 * uVar9 + uVar19] = fVar29;
                          prVar25 = prVar25 + uVar8;
                          lVar16 = lVar16 + 1;
                        }
                        prVar10 = prVar10 + uVar9;
                      }
                      return 0;
                    }
                    for (uVar20 = 1; uVar20 != uVar13; uVar20 = uVar20 + 1) {
                      lVar16 = uVar20 * uVar9;
                      for (uVar19 = (ulong)*m; 0 < (long)uVar19; uVar19 = uVar19 - 1) {
                        fVar29 = *alpha * b[uVar15 + lVar16 + uVar19];
                        uVar22 = uVar19 & 0xffffffff;
                        while ((int)uVar22 < *m) {
                          uVar18 = (int)uVar22 + 1;
                          fVar29 = fVar29 - a[uVar12 + uVar19 * uVar8 + (long)(int)uVar18] *
                                            b[uVar15 + lVar16 + (int)uVar18];
                          uVar22 = (ulong)uVar18;
                        }
                        if (lVar3 != 0) {
                          fVar29 = fVar29 / a[uVar12 + (long)(iVar11 * (int)uVar19)];
                        }
                        b[uVar15 + lVar16 + uVar19] = fVar29;
                      }
                    }
                    return 0;
                  }
                  if (lVar5 == 0) {
                    if (lVar4 != 0) {
                      prVar10 = b + uVar15 + uVar13 * uVar9 + 1;
                      uVar20 = 0;
                      for (; 0 < (long)uVar13; uVar13 = uVar13 - 1) {
                        if (lVar3 != 0) {
                          fVar29 = a[uVar12 + (long)(iVar11 * (int)uVar13)];
                          uVar19 = (ulong)(uint)*m;
                          if (*m < 1) {
                            uVar19 = uVar20;
                          }
                          for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
                            prVar10[uVar22] = prVar10[uVar22] * (1.0 / fVar29);
                          }
                        }
                        lVar24 = uVar13 * uVar9;
                        prVar25 = b + uVar15 + uVar9 + 1;
                        for (lVar16 = 1; lVar16 < (long)uVar13; lVar16 = lVar16 + 1) {
                          fVar29 = a[uVar12 + uVar13 * uVar8 + lVar16];
                          if ((fVar29 != 0.0) || (NAN(fVar29))) {
                            uVar19 = (ulong)(uint)*m;
                            if (*m < 1) {
                              uVar19 = uVar20;
                            }
                            for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
                              prVar25[uVar22] =
                                   b[uVar15 + lVar24 + uVar22 + 1] * -fVar29 + prVar25[uVar22];
                            }
                          }
                          prVar25 = prVar25 + uVar9;
                        }
                        if ((*alpha != 1.0) || (NAN(*alpha))) {
                          uVar19 = (ulong)(uint)*m;
                          if (*m < 1) {
                            uVar19 = uVar20;
                          }
                          for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
                            b[uVar15 + lVar24 + uVar22 + 1] =
                                 *alpha * b[uVar15 + lVar24 + uVar22 + 1];
                          }
                        }
                        prVar10 = prVar10 + -uVar9;
                      }
                      return 0;
                    }
                    uVar7 = 0;
                    if ((int)uVar18 < 1) {
                      uVar18 = uVar7;
                    }
                    prVar10 = b + uVar15 + uVar9 + 1;
                    iVar14 = iVar21 * 2;
                    for (uVar13 = 1; uVar13 != uVar18 + 1; uVar13 = uVar13 + 1) {
                      if (lVar3 != 0) {
                        fVar29 = a[uVar12 + (long)(iVar11 * (int)uVar13)];
                        uVar6 = *m;
                        if (*m < 1) {
                          uVar6 = uVar7;
                        }
                        for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
                          prVar10[uVar20] = prVar10[uVar20] * (1.0 / fVar29);
                        }
                      }
                      lVar16 = uVar13 * uVar9;
                      iVar1 = *n;
                      uVar20 = uVar13;
                      iVar17 = iVar14;
                      while ((int)uVar20 < iVar1) {
                        uVar6 = (int)uVar20 + 1;
                        uVar20 = (ulong)uVar6;
                        fVar29 = a[uVar12 + uVar13 * uVar8 + (long)(int)uVar6];
                        if ((fVar29 != 0.0) || (NAN(fVar29))) {
                          uVar6 = *m;
                          if (*m < 1) {
                            uVar6 = uVar7;
                          }
                          for (uVar19 = 0; uVar6 != uVar19; uVar19 = uVar19 + 1) {
                            b[uVar15 + (long)iVar17 + uVar19 + 1] =
                                 b[uVar15 + lVar16 + uVar19 + 1] * -fVar29 +
                                 b[uVar15 + (long)iVar17 + uVar19 + 1];
                          }
                        }
                        iVar17 = iVar17 + iVar21;
                      }
                      if ((*alpha != 1.0) || (NAN(*alpha))) {
                        uVar6 = *m;
                        if (*m < 1) {
                          uVar6 = uVar7;
                        }
                        for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
                          b[uVar15 + lVar16 + uVar20 + 1] = *alpha * b[uVar15 + lVar16 + uVar20 + 1]
                          ;
                        }
                      }
                      prVar10 = prVar10 + uVar9;
                      iVar14 = iVar14 + iVar21;
                    }
                    return 0;
                  }
                  if (lVar4 != 0) {
                    uVar6 = 0;
                    uVar7 = 0;
                    if (0 < (int)uVar18) {
                      uVar7 = uVar18;
                    }
                    prVar10 = b + uVar15 + uVar9 + 1;
                    for (uVar13 = 1; uVar13 != uVar7 + 1; uVar13 = uVar13 + 1) {
                      if ((*alpha != 1.0) || (NAN(*alpha))) {
                        uVar18 = *m;
                        if (*m < 1) {
                          uVar18 = uVar6;
                        }
                        for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                          prVar10[uVar20] = *alpha * prVar10[uVar20];
                        }
                      }
                      lVar16 = uVar13 * uVar9;
                      prVar25 = b + uVar15 + uVar9 + 1;
                      for (uVar20 = 1; uVar20 != uVar13; uVar20 = uVar20 + 1) {
                        if ((a[uVar12 + uVar13 * uVar8 + uVar20] != 0.0) ||
                           (NAN(a[uVar12 + uVar13 * uVar8 + uVar20]))) {
                          uVar18 = *m;
                          if (*m < 1) {
                            uVar18 = uVar6;
                          }
                          for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                            b[uVar15 + lVar16 + uVar19 + 1] =
                                 b[uVar15 + lVar16 + uVar19 + 1] -
                                 a[uVar12 + uVar13 * uVar8 + uVar20] * prVar25[uVar19];
                          }
                        }
                        prVar25 = prVar25 + uVar9;
                      }
                      if (lVar3 != 0) {
                        fVar29 = a[uVar12 + (long)(iVar11 * (int)uVar13)];
                        uVar18 = *m;
                        if (*m < 1) {
                          uVar18 = uVar6;
                        }
                        for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                          b[uVar15 + lVar16 + uVar20 + 1] =
                               b[uVar15 + lVar16 + uVar20 + 1] * (1.0 / fVar29);
                        }
                      }
                      prVar10 = prVar10 + uVar9;
                    }
                    return 0;
                  }
                  prVar10 = b + uVar15 + uVar13 * uVar9 + 1;
                  iVar14 = (uVar18 + 1) * iVar21;
                  for (; 0 < (long)uVar13; uVar13 = uVar13 - 1) {
                    if ((*alpha != 1.0) || (NAN(*alpha))) {
                      uVar20 = (ulong)(uint)*m;
                      if (*m < 1) {
                        uVar20 = 0;
                      }
                      for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
                        prVar10[uVar19] = *alpha * prVar10[uVar19];
                      }
                    }
                    lVar16 = uVar13 * uVar9;
                    iVar1 = *n;
                    uVar20 = uVar13 & 0xffffffff;
                    iVar17 = iVar14;
                    while ((int)uVar20 < iVar1) {
                      uVar18 = (int)uVar20 + 1;
                      uVar20 = (ulong)uVar18;
                      if ((a[uVar12 + uVar13 * uVar8 + (long)(int)uVar18] != 0.0) ||
                         (NAN(a[uVar12 + uVar13 * uVar8 + (long)(int)uVar18]))) {
                        uVar19 = (ulong)(uint)*m;
                        if (*m < 1) {
                          uVar19 = 0;
                        }
                        for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
                          b[uVar15 + lVar16 + uVar22 + 1] =
                               b[uVar15 + lVar16 + uVar22 + 1] -
                               a[uVar12 + uVar13 * uVar8 + (long)(int)uVar18] *
                               b[uVar15 + (long)iVar17 + uVar22 + 1];
                        }
                      }
                      iVar17 = iVar17 + iVar21;
                    }
                    if (lVar3 != 0) {
                      fVar29 = a[uVar12 + (long)(iVar11 * (int)uVar13)];
                      uVar20 = (ulong)(uint)*m;
                      if (*m < 1) {
                        uVar20 = 0;
                      }
                      for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
                        b[uVar15 + lVar16 + uVar19 + 1] =
                             b[uVar15 + lVar16 + uVar19 + 1] * (1.0 / fVar29);
                      }
                    }
                    prVar10 = prVar10 + -uVar9;
                    iVar14 = iVar14 - iVar21;
                  }
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  strsm_::info = iVar26;
  xerbla_("STRSM ",&strsm_::info);
  return 0;
}

Assistant:

int strsm_(char *side, char *uplo, char *transa, char *diag,
	integer *m, integer *n, real *alpha, real *a, integer *lda, real *b,
	integer *ldb)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp;
    static logical lside;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);
    static logical nounit;


/*
    Purpose
    =======

    STRSM  solves one of the matrix equations

       op( A )*X = alpha*B,   or   X*op( A ) = alpha*B,

    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of

       op( A ) = A   or   op( A ) = A'.

    The matrix X is overwritten on B.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry, SIDE specifies whether op( A ) appears on the left
             or right of X as follows:

                SIDE = 'L' or 'l'   op( A )*X = alpha*B.

                SIDE = 'R' or 'r'   X*op( A ) = alpha*B.

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On entry, UPLO specifies whether the matrix A is an upper or
             lower triangular matrix as follows:

                UPLO = 'U' or 'u'   A is an upper triangular matrix.

                UPLO = 'L' or 'l'   A is a lower triangular matrix.

             Unchanged on exit.

    TRANSA - CHARACTER*1.
             On entry, TRANSA specifies the form of op( A ) to be used in
             the matrix multiplication as follows:

                TRANSA = 'N' or 'n'   op( A ) = A.

                TRANSA = 'T' or 't'   op( A ) = A'.

                TRANSA = 'C' or 'c'   op( A ) = A'.

             Unchanged on exit.

    DIAG   - CHARACTER*1.
             On entry, DIAG specifies whether or not A is unit triangular
             as follows:

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.

                DIAG = 'N' or 'n'   A is not assumed to be unit
                                    triangular.

             Unchanged on exit.

    M      - INTEGER.
             On entry, M specifies the number of rows of B. M must be at
             least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of B.  N must be
             at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry,  ALPHA specifies the scalar  alpha. When  alpha is
             zero then  A is not referenced and  B need not be set before
             entry.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, k ), where k is m
             when  SIDE = 'L' or 'l'  and is  n  when  SIDE = 'R' or 'r'.
             Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
             upper triangular part of the array  A must contain the upper
             triangular matrix  and the strictly lower triangular part of
             A is not referenced.
             Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
             lower triangular part of the array  A must contain the lower
             triangular matrix  and the strictly upper triangular part of
             A is not referenced.
             Note that when  DIAG = 'U' or 'u',  the diagonal elements of
             A  are not referenced either,  but are assumed to be  unity.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
             then LDA must be at least max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry,  the leading  m by n part of the array  B must
             contain  the  right-hand  side  matrix  B,  and  on exit  is
             overwritten by the solution matrix  X.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.


    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;

    /* Function Body */
    lside = lsame_(side, "L");
    if (lside) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    nounit = lsame_(diag, "N");
    upper = lsame_(uplo, "U");

    info = 0;
    if (! lside && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (! lsame_(transa, "N") && ! lsame_(transa,
	     "T") && ! lsame_(transa, "C")) {
	info = 3;
    } else if (! lsame_(diag, "U") && ! lsame_(diag,
	    "N")) {
	info = 4;
    } else if (*m < 0) {
	info = 5;
    } else if (*n < 0) {
	info = 6;
    } else if (*lda < max(1,nrowa)) {
	info = 9;
    } else if (*ldb < max(1,*m)) {
	info = 11;
    }
    if (info != 0) {
	xerbla_("STRSM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    i__2 = *m;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		b[i__ + j * b_dim1] = 0.f;
/* L10: */
	    }
/* L20: */
	}
	return 0;
    }

/*     Start the operations. */

    if (lside) {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*inv( A )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L30: */
			}
		    }
		    for (k = *m; k >= 1; --k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__2 = k - 1;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L40: */
			    }
			}
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L70: */
			}
		    }
		    i__2 = *m;
		    for (k = 1; k <= i__2; ++k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__3 = *m;
			    for (i__ = k + 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L80: */
			    }
			}
/* L90: */
		    }
/* L100: */
		}
	    }
	} else {

/*           Form  B := alpha*inv( A' )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__3 = i__ - 1;
			for (k = 1; k <= i__3; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L110: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L120: */
		    }
/* L130: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    for (i__ = *m; i__ >= 1; --i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__2 = *m;
			for (k = i__ + 1; k <= i__2; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L140: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L150: */
		    }
/* L160: */
		}
	    }
	}
    } else {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*B*inv( A ). */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L170: */
			}
		    }
		    i__2 = j - 1;
		    for (k = 1; k <= i__2; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L180: */
			    }
			}
/* L190: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L200: */
			}
		    }
/* L210: */
		}
	    } else {
		for (j = *n; j >= 1; --j) {
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L220: */
			}
		    }
		    i__1 = *n;
		    for (k = j + 1; k <= i__1; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L230: */
			    }
			}
/* L240: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L250: */
			}
		    }
/* L260: */
		}
	    }
	} else {

/*           Form  B := alpha*B*inv( A' ). */

	    if (upper) {
		for (k = *n; k >= 1; --k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L270: */
			}
		    }
		    i__1 = k - 1;
		    for (j = 1; j <= i__1; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L280: */
			    }
			}
/* L290: */
		    }
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L300: */
			}
		    }
/* L310: */
		}
	    } else {
		i__1 = *n;
		for (k = 1; k <= i__1; ++k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L320: */
			}
		    }
		    i__2 = *n;
		    for (j = k + 1; j <= i__2; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L330: */
			    }
			}
/* L340: */
		    }
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L350: */
			}
		    }
/* L360: */
		}
	    }
	}
    }

    return 0;

/*     End of STRSM . */

}